

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

nhr_bool nhr_request_send_buffer(nhr_request r,void *data,size_t data_size)

{
  ssize_t sVar1;
  int *piVar2;
  int error_number;
  int send_result;
  size_t data_size_local;
  void *data_local;
  nhr_request r_local;
  
  r->error_code = nhr_error_code_none;
  sVar1 = send(r->socket,data,(long)(int)data_size,0);
  piVar2 = __errno_location();
  if ((int)sVar1 < 1) {
    if (*piVar2 < 1) {
      r_local._7_1_ = '\x01';
    }
    else {
      r_local._7_1_ = '\0';
    }
  }
  else {
    r_local._7_1_ = '\x01';
  }
  return r_local._7_1_;
}

Assistant:

nhr_bool nhr_request_send_buffer(nhr_request r, const void * data, const size_t data_size) {
	int send_result = -1, error_number = -1;
	r->error_code = nhr_error_code_none;

#if defined(NHR_OS_WINDOWS)
	send_result = send(r->socket, (const char *)data, data_size, 0);
	error_number = WSAGetLastError();
#else
	send_result = (int)send(r->socket, data, (int)data_size, 0);
	error_number = errno;
#endif

	if (send_result > 0) {
		return nhr_true;
	}
	if (error_number > 0) {
		return nhr_false;
	}
	return nhr_true;
}